

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_regex.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  ostream *poVar4;
  runtime_error *prVar5;
  re_registers *in_R9;
  exception *e;
  ostringstream oss_39;
  ostringstream oss_38;
  ostringstream oss_37;
  ostringstream oss_36;
  regex rc;
  ostringstream oss_35;
  ostringstream oss_34;
  regex r;
  ostringstream oss_33;
  ostringstream oss_32;
  ostringstream oss_31;
  ostringstream oss_30;
  ostringstream oss_29;
  ostringstream oss_28;
  ostringstream oss_27;
  ostringstream oss_26;
  cmatch cm;
  regex re;
  ostringstream oss_25;
  regex_error *anon_var_0_1;
  ostringstream oss_24;
  regex_error *anon_var_0;
  ostringstream oss_23;
  ostringstream oss_22;
  ostringstream oss_21;
  int prop;
  ostringstream oss_20;
  ostringstream oss_19;
  ostringstream oss_18;
  ostringstream oss_17;
  ostringstream oss_16;
  ostringstream oss_15;
  ostringstream oss_14;
  ostringstream oss_13;
  ostringstream oss_12;
  ostringstream oss_11;
  ostringstream oss_10;
  ostringstream oss_9;
  ostringstream oss_8;
  ostringstream oss_7;
  ostringstream oss_6;
  ostringstream oss_5;
  ostringstream oss_4;
  ostringstream oss_3;
  ostringstream oss_2;
  ostringstream oss_1;
  ostringstream oss;
  char *in_stack_ffffffffffffa8c8;
  match_results<const_char_*> *in_stack_ffffffffffffa8d0;
  match_results<const_char_*> *in_stack_ffffffffffffa8e0;
  regex *in_stack_ffffffffffffa8e8;
  char *in_stack_ffffffffffffa8f0;
  undefined8 in_stack_ffffffffffffa920;
  int iVar6;
  regex *in_stack_ffffffffffffa928;
  undefined7 in_stack_ffffffffffffa930;
  undefined1 in_stack_ffffffffffffa937;
  char *in_stack_ffffffffffffa938;
  bool local_55ca;
  bool local_556a;
  bool local_550a;
  undefined8 in_stack_ffffffffffffab00;
  string *in_stack_ffffffffffffab08;
  string *in_stack_ffffffffffffab10;
  string *in_stack_ffffffffffffab18;
  undefined7 in_stack_ffffffffffffab20;
  undefined1 in_stack_ffffffffffffab27;
  bool local_54aa;
  string local_4d30 [32];
  ostringstream local_4d10 [383];
  undefined1 local_4b91;
  string local_4b90 [32];
  ostringstream local_4b70 [383];
  undefined1 local_49f1;
  string local_49f0 [32];
  ostringstream local_49d0 [383];
  undefined1 local_4851;
  string local_4850 [32];
  ostringstream local_4830 [376];
  regex local_46b8 [15];
  undefined1 local_46a9;
  string local_46a8 [32];
  ostringstream local_4688 [383];
  undefined1 local_4509;
  string local_4508 [32];
  ostringstream local_44e8 [376];
  string local_4370 [39];
  allocator local_4349;
  string local_4348 [32];
  regex local_4328 [15];
  undefined1 local_4319;
  string local_4318 [32];
  ostringstream local_42f8 [431];
  undefined1 local_4149;
  string local_4148 [32];
  ostringstream local_4128 [383];
  undefined1 local_3fa9;
  string local_3fa8 [32];
  ostringstream local_3f88 [431];
  undefined1 local_3dd9;
  string local_3dd8 [32];
  ostringstream local_3db8 [383];
  undefined1 local_3c39;
  string local_3c38 [32];
  ostringstream local_3c18 [431];
  undefined1 local_3a69;
  string local_3a68 [32];
  ostringstream local_3a48 [328];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffc700;
  string local_38c8 [32];
  ostringstream local_38a8 [431];
  undefined1 local_36f9;
  string local_36f8 [32];
  ostringstream local_36d8 [423];
  allocator local_3531;
  string local_3530 [32];
  regex local_3510 [15];
  allocator local_3501;
  string local_3500 [39];
  allocator local_34d9;
  string local_34d8 [39];
  allocator local_34b1;
  string local_34b0 [39];
  allocator local_3489;
  string local_3488 [39];
  allocator local_3461;
  string local_3460 [39];
  allocator local_3439;
  string local_3438 [39];
  allocator local_3411;
  string local_3410 [39];
  allocator local_33e9;
  string local_33e8 [39];
  allocator local_33c1;
  string local_33c0 [39];
  allocator local_3399;
  string local_3398 [39];
  allocator local_3371;
  string local_3370 [39];
  allocator local_3349;
  string local_3348 [39];
  allocator local_3321;
  string local_3320 [39];
  allocator local_32f9;
  string local_32f8 [39];
  allocator local_32d1;
  string local_32d0 [39];
  allocator local_32a9;
  string local_32a8 [39];
  undefined1 local_3281;
  string local_3280 [32];
  ostringstream local_3260 [391];
  allocator local_30d9;
  string local_30d8 [39];
  allocator local_30b1;
  string local_30b0 [39];
  undefined1 local_3089;
  string local_3088 [32];
  ostringstream local_3068 [391];
  allocator local_2ee1;
  string local_2ee0 [39];
  allocator local_2eb9;
  string local_2eb8 [39];
  undefined1 local_2e91;
  string local_2e90 [32];
  ostringstream local_2e70 [383];
  allocator local_2cf1;
  string local_2cf0 [39];
  allocator local_2cc9;
  string local_2cc8 [39];
  undefined1 local_2ca1;
  string local_2ca0 [32];
  ostringstream local_2c80 [383];
  allocator local_2b01;
  string local_2b00 [39];
  allocator local_2ad9;
  string local_2ad8 [39];
  undefined1 local_2ab1;
  string local_2ab0 [32];
  ostringstream local_2a90 [383];
  allocator local_2911;
  string local_2910 [39];
  allocator local_28e9;
  string local_28e8 [32];
  int local_28c8;
  undefined1 local_28c1;
  string local_28c0 [32];
  ostringstream local_28a0 [383];
  allocator local_2721;
  string local_2720 [39];
  allocator local_26f9;
  string local_26f8 [39];
  undefined1 local_26d1;
  string local_26d0 [32];
  ostringstream local_26b0 [383];
  allocator local_2531;
  string local_2530 [39];
  allocator local_2509;
  string local_2508 [39];
  undefined1 local_24e1;
  string local_24e0 [32];
  ostringstream local_24c0 [383];
  allocator local_2341;
  string local_2340 [39];
  allocator local_2319;
  string local_2318 [39];
  undefined1 local_22f1;
  string local_22f0 [32];
  ostringstream local_22d0 [383];
  allocator local_2151;
  string local_2150 [39];
  allocator local_2129;
  string local_2128 [39];
  undefined1 local_2101;
  string local_2100 [32];
  ostringstream local_20e0 [383];
  allocator local_1f61;
  string local_1f60 [39];
  allocator local_1f39;
  string local_1f38 [39];
  undefined1 local_1f11;
  string local_1f10 [32];
  ostringstream local_1ef0 [383];
  allocator local_1d71;
  string local_1d70 [39];
  allocator local_1d49;
  string local_1d48 [39];
  undefined1 local_1d21;
  string local_1d20 [32];
  ostringstream local_1d00 [383];
  allocator local_1b81;
  string local_1b80 [39];
  allocator local_1b59;
  string local_1b58 [39];
  undefined1 local_1b31;
  string local_1b30 [32];
  ostringstream local_1b10 [383];
  allocator local_1991;
  string local_1990 [39];
  allocator local_1969;
  string local_1968 [39];
  undefined1 local_1941;
  string local_1940 [32];
  ostringstream local_1920 [383];
  allocator local_17a1;
  string local_17a0 [39];
  allocator local_1779;
  string local_1778 [39];
  undefined1 local_1751;
  string local_1750 [32];
  ostringstream local_1730 [383];
  allocator local_15b1;
  string local_15b0 [39];
  allocator local_1589;
  string local_1588 [39];
  undefined1 local_1561;
  string local_1560 [32];
  ostringstream local_1540 [383];
  allocator local_13c1;
  string local_13c0 [39];
  allocator local_1399;
  string local_1398 [39];
  undefined1 local_1371;
  string local_1370 [32];
  ostringstream local_1350 [383];
  allocator local_11d1;
  string local_11d0 [39];
  allocator local_11a9;
  string local_11a8 [39];
  undefined1 local_1181;
  string local_1180 [32];
  ostringstream local_1160 [383];
  allocator local_fe1;
  string local_fe0 [39];
  allocator local_fb9;
  string local_fb8 [39];
  undefined1 local_f91;
  string local_f90 [32];
  ostringstream local_f70 [383];
  allocator local_df1;
  string local_df0 [39];
  allocator local_dc9;
  string local_dc8 [39];
  undefined1 local_da1;
  string local_da0 [32];
  ostringstream local_d80 [383];
  allocator local_c01;
  string local_c00 [39];
  allocator local_bd9;
  string local_bd8 [39];
  undefined1 local_bb1;
  string local_bb0 [32];
  ostringstream local_b90 [383];
  allocator local_a11;
  string local_a10 [39];
  allocator local_9e9;
  string local_9e8 [39];
  undefined1 local_9c1;
  string local_9c0 [32];
  ostringstream local_9a0 [383];
  allocator local_821;
  string local_820 [39];
  allocator local_7f9;
  string local_7f8 [39];
  undefined1 local_7d1;
  string local_7d0 [32];
  ostringstream local_7b0 [383];
  allocator local_631;
  string local_630 [39];
  allocator local_609;
  string local_608 [39];
  undefined1 local_5e1;
  string local_5e0 [32];
  ostringstream local_5c0 [383];
  allocator local_441;
  string local_440 [39];
  allocator local_419;
  string local_418 [39];
  undefined1 local_3f1;
  string local_3f0 [32];
  ostringstream local_3d0 [383];
  allocator local_251;
  string local_250 [39];
  allocator local_229;
  string local_228 [39];
  undefined1 local_201;
  string local_200 [32];
  ostringstream local_1e0 [383];
  allocator local_61;
  string local_60 [39];
  allocator local_39;
  string local_38 [52];
  undefined4 local_4;
  
  iVar6 = (int)((ulong)in_stack_ffffffffffffa920 >> 0x20);
  iVar3 = (int)((ulong)in_stack_ffffffffffffab00 >> 0x20);
  local_4 = 0;
  poVar4 = std::operator<<((ostream *)&std::cout,"Testing search/match");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"foo",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"foo",&local_61);
  bVar1 = search((string *)CONCAT17(in_stack_ffffffffffffab27,in_stack_ffffffffffffab20),
                 in_stack_ffffffffffffab18,(int)((ulong)in_stack_ffffffffffffab10 >> 0x20));
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1e0);
    poVar4 = std::operator<<((ostream *)local_1e0,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xa1);
    std::operator<<(poVar4," search(\"foo\",\"foo\")");
    local_201 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_200);
    local_201 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_228,"foo",&local_229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,"foobar",&local_251);
  bVar1 = search((string *)CONCAT17(in_stack_ffffffffffffab27,in_stack_ffffffffffffab20),
                 in_stack_ffffffffffffab18,(int)((ulong)in_stack_ffffffffffffab10 >> 0x20));
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_3d0);
    poVar4 = std::operator<<((ostream *)local_3d0,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xa2);
    std::operator<<(poVar4," search(\"foo\",\"foobar\")");
    local_3f1 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_3f0);
    local_3f1 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_418,"foo",&local_419);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_440,"zeefoo",&local_441);
  bVar1 = search((string *)CONCAT17(in_stack_ffffffffffffab27,in_stack_ffffffffffffab20),
                 in_stack_ffffffffffffab18,(int)((ulong)in_stack_ffffffffffffab10 >> 0x20));
  std::__cxx11::string::~string(local_440);
  std::allocator<char>::~allocator((allocator<char> *)&local_441);
  std::__cxx11::string::~string(local_418);
  std::allocator<char>::~allocator((allocator<char> *)&local_419);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_5c0);
    poVar4 = std::operator<<((ostream *)local_5c0,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xa3);
    std::operator<<(poVar4," search(\"foo\",\"zeefoo\")");
    local_5e1 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_5e0);
    local_5e1 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_608,"foo",&local_609);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_630,"bar",&local_631);
  bVar1 = search((string *)CONCAT17(in_stack_ffffffffffffab27,in_stack_ffffffffffffab20),
                 in_stack_ffffffffffffab18,(int)((ulong)in_stack_ffffffffffffab10 >> 0x20));
  std::__cxx11::string::~string(local_630);
  std::allocator<char>::~allocator((allocator<char> *)&local_631);
  std::__cxx11::string::~string(local_608);
  std::allocator<char>::~allocator((allocator<char> *)&local_609);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_7b0);
    poVar4 = std::operator<<((ostream *)local_7b0,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xa4);
    std::operator<<(poVar4," !search(\"foo\",\"bar\")");
    local_7d1 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_7d0);
    local_7d1 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7f8,"foo",&local_7f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_820,"foo",&local_821);
  bVar1 = match(in_stack_ffffffffffffab10,in_stack_ffffffffffffab08,iVar3);
  std::__cxx11::string::~string(local_820);
  std::allocator<char>::~allocator((allocator<char> *)&local_821);
  std::__cxx11::string::~string(local_7f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7f9);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_9a0);
    poVar4 = std::operator<<((ostream *)local_9a0,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xa6);
    std::operator<<(poVar4," match(\"foo\",\"foo\")");
    local_9c1 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_9c0);
    local_9c1 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9e8,"(http|https|ftp|mailto)",&local_9e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a10,"https",&local_a11);
  bVar1 = match(in_stack_ffffffffffffab10,in_stack_ffffffffffffab08,iVar3);
  std::__cxx11::string::~string(local_a10);
  std::allocator<char>::~allocator((allocator<char> *)&local_a11);
  std::__cxx11::string::~string(local_9e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9e9);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_b90);
    poVar4 = std::operator<<((ostream *)local_b90,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xa7);
    std::operator<<(poVar4," match(\"(http|https|ftp|mailto)\",\"https\")");
    local_bb1 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_bb0);
    local_bb1 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_bd8,"foo",&local_bd9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c00,"zeefoo",&local_c01);
  bVar1 = match(in_stack_ffffffffffffab10,in_stack_ffffffffffffab08,iVar3);
  std::__cxx11::string::~string(local_c00);
  std::allocator<char>::~allocator((allocator<char> *)&local_c01);
  std::__cxx11::string::~string(local_bd8);
  std::allocator<char>::~allocator((allocator<char> *)&local_bd9);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_d80);
    poVar4 = std::operator<<((ostream *)local_d80,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xa8);
    std::operator<<(poVar4," !match(\"foo\",\"zeefoo\")");
    local_da1 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_da0);
    local_da1 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_dc8,"foo",&local_dc9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_df0,"foobar",&local_df1);
  bVar1 = match(in_stack_ffffffffffffab10,in_stack_ffffffffffffab08,iVar3);
  std::__cxx11::string::~string(local_df0);
  std::allocator<char>::~allocator((allocator<char> *)&local_df1);
  std::__cxx11::string::~string(local_dc8);
  std::allocator<char>::~allocator((allocator<char> *)&local_dc9);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_f70);
    poVar4 = std::operator<<((ostream *)local_f70,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xa9);
    std::operator<<(poVar4," !match(\"foo\",\"foobar\")");
    local_f91 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_f90);
    local_f91 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_fb8,"(foo)",&local_fb9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_fe0,"foo",&local_fe1);
  bVar1 = match(in_stack_ffffffffffffab10,in_stack_ffffffffffffab08,iVar3);
  std::__cxx11::string::~string(local_fe0);
  std::allocator<char>::~allocator((allocator<char> *)&local_fe1);
  std::__cxx11::string::~string(local_fb8);
  std::allocator<char>::~allocator((allocator<char> *)&local_fb9);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1160);
    poVar4 = std::operator<<((ostream *)local_1160,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xaa);
    std::operator<<(poVar4," match(\"(foo)\",\"foo\")");
    local_1181 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_1180);
    local_1181 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_11a8,"(foo)",&local_11a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_11d0,"zeefoo",&local_11d1);
  bVar1 = match(in_stack_ffffffffffffab10,in_stack_ffffffffffffab08,iVar3);
  std::__cxx11::string::~string(local_11d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_11d1);
  std::__cxx11::string::~string(local_11a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_11a9);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_1350);
    poVar4 = std::operator<<((ostream *)local_1350,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xab);
    std::operator<<(poVar4," !match(\"(foo)\",\"zeefoo\")");
    local_1371 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_1370);
    local_1371 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1398,"(foo)",&local_1399);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_13c0,"foobar",&local_13c1);
  bVar1 = match(in_stack_ffffffffffffab10,in_stack_ffffffffffffab08,iVar3);
  std::__cxx11::string::~string(local_13c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_13c1);
  std::__cxx11::string::~string(local_1398);
  std::allocator<char>::~allocator((allocator<char> *)&local_1399);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_1540);
    poVar4 = std::operator<<((ostream *)local_1540,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xac);
    std::operator<<(poVar4," !match(\"(foo)\",\"foobar\")");
    local_1561 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_1560);
    local_1561 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1588,"((((((((((foo))))))))))",&local_1589);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_15b0,"foo",&local_15b1);
  bVar1 = match(in_stack_ffffffffffffab10,in_stack_ffffffffffffab08,iVar3);
  std::__cxx11::string::~string(local_15b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_15b1);
  std::__cxx11::string::~string(local_1588);
  std::allocator<char>::~allocator((allocator<char> *)&local_1589);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1730);
    poVar4 = std::operator<<((ostream *)local_1730,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xad);
    std::operator<<(poVar4," match(\"((((((((((foo))))))))))\",\"foo\")");
    local_1751 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_1750);
    local_1751 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1778,"((((((((((foo))))))))))",&local_1779);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_17a0,"foox",&local_17a1);
  bVar1 = match(in_stack_ffffffffffffab10,in_stack_ffffffffffffab08,iVar3);
  std::__cxx11::string::~string(local_17a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_17a1);
  std::__cxx11::string::~string(local_1778);
  std::allocator<char>::~allocator((allocator<char> *)&local_1779);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_1920);
    poVar4 = std::operator<<((ostream *)local_1920,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xae);
    std::operator<<(poVar4," !match(\"((((((((((foo))))))))))\",\"foox\")");
    local_1941 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_1940);
    local_1941 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1968,"((((((((((foo))))))))))",&local_1969);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1990,"xfoo",&local_1991);
  bVar1 = match(in_stack_ffffffffffffab10,in_stack_ffffffffffffab08,iVar3);
  std::__cxx11::string::~string(local_1990);
  std::allocator<char>::~allocator((allocator<char> *)&local_1991);
  std::__cxx11::string::~string(local_1968);
  std::allocator<char>::~allocator((allocator<char> *)&local_1969);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_1b10);
    poVar4 = std::operator<<((ostream *)local_1b10,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xaf);
    std::operator<<(poVar4," !match(\"((((((((((foo))))))))))\",\"xfoo\")");
    local_1b31 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_1b30);
    local_1b31 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b58,"a",&local_1b59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b80,"A",&local_1b81);
  bVar1 = match(in_stack_ffffffffffffab10,in_stack_ffffffffffffab08,iVar3);
  std::__cxx11::string::~string(local_1b80);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b81);
  std::__cxx11::string::~string(local_1b58);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b59);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_1d00);
    poVar4 = std::operator<<((ostream *)local_1d00,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xb1);
    std::operator<<(poVar4," !match(\"a\",\"A\",0)");
    local_1d21 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_1d20);
    local_1d21 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d48,"a",&local_1d49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d70,"xAz",&local_1d71);
  bVar1 = search((string *)CONCAT17(in_stack_ffffffffffffab27,in_stack_ffffffffffffab20),
                 in_stack_ffffffffffffab18,(int)((ulong)in_stack_ffffffffffffab10 >> 0x20));
  std::__cxx11::string::~string(local_1d70);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d71);
  std::__cxx11::string::~string(local_1d48);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d49);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_1ef0);
    poVar4 = std::operator<<((ostream *)local_1ef0,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xb2);
    std::operator<<(poVar4," !search(\"a\",\"xAz\",0)");
    local_1f11 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_1f10);
    local_1f11 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f38,"a",&local_1f39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f60,"A",&local_1f61);
  bVar1 = match(in_stack_ffffffffffffab10,in_stack_ffffffffffffab08,iVar3);
  std::__cxx11::string::~string(local_1f60);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f61);
  std::__cxx11::string::~string(local_1f38);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f39);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_20e0);
    poVar4 = std::operator<<((ostream *)local_20e0,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xb3);
    std::operator<<(poVar4," match(\"a\",\"A\",booster::regex::icase)");
    local_2101 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_2100);
    local_2101 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2128,"a",&local_2129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2150,"xAz",&local_2151);
  bVar1 = search((string *)CONCAT17(in_stack_ffffffffffffab27,in_stack_ffffffffffffab20),
                 in_stack_ffffffffffffab18,(int)((ulong)in_stack_ffffffffffffab10 >> 0x20));
  std::__cxx11::string::~string(local_2150);
  std::allocator<char>::~allocator((allocator<char> *)&local_2151);
  std::__cxx11::string::~string(local_2128);
  std::allocator<char>::~allocator((allocator<char> *)&local_2129);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_22d0);
    poVar4 = std::operator<<((ostream *)local_22d0,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xb4);
    std::operator<<(poVar4," search(\"a\",\"xAz\",booster::regex::icase)");
    local_22f1 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_22f0);
    local_22f1 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar2 = booster::regex::utf8_supported();
  if ((bVar2 & 1) == 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"UTF-8 is not compiled in");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30b0,".",&local_30b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30d8,"a",&local_30d9);
    match(in_stack_ffffffffffffab10,in_stack_ffffffffffffab08,iVar3);
    std::__cxx11::string::~string(local_30d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_30d9);
    std::__cxx11::string::~string(local_30b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_30b1);
    std::__cxx11::ostringstream::ostringstream(local_3260);
    poVar4 = std::operator<<((ostream *)local_3260,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xcf);
    std::operator<<(poVar4," match(\".\",\"a\",booster::regex::utf8)");
    local_3281 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_3280);
    local_3281 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"Testing UTF-8");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2318,".",&local_2319);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2340,anon_var_dwarf_32e4,&local_2341);
  bVar1 = match(in_stack_ffffffffffffab10,in_stack_ffffffffffffab08,iVar3);
  std::__cxx11::string::~string(local_2340);
  std::allocator<char>::~allocator((allocator<char> *)&local_2341);
  std::__cxx11::string::~string(local_2318);
  std::allocator<char>::~allocator((allocator<char> *)&local_2319);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_24c0);
    poVar4 = std::operator<<((ostream *)local_24c0,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xba);
    std::operator<<(poVar4," match(\".\",\"\\xD7\\x90\",booster::regex::utf8)");
    local_24e1 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_24e0);
    local_24e1 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2508,".",&local_2509);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2530,anon_var_dwarf_3310,&local_2531);
  bVar1 = match(in_stack_ffffffffffffab10,in_stack_ffffffffffffab08,iVar3);
  std::__cxx11::string::~string(local_2530);
  std::allocator<char>::~allocator((allocator<char> *)&local_2531);
  std::__cxx11::string::~string(local_2508);
  std::allocator<char>::~allocator((allocator<char> *)&local_2509);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_26b0);
    poVar4 = std::operator<<((ostream *)local_26b0,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xbb);
    std::operator<<(poVar4," match(\".\",\"\\xD0\\x96\",booster::regex::utf8)");
    local_26d1 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_26d0);
    local_26d1 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_26f8,anon_var_dwarf_3310,&local_26f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2720,anon_var_dwarf_3324,&local_2721);
  bVar1 = match(in_stack_ffffffffffffab10,in_stack_ffffffffffffab08,iVar3);
  std::__cxx11::string::~string(local_2720);
  std::allocator<char>::~allocator((allocator<char> *)&local_2721);
  std::__cxx11::string::~string(local_26f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_26f9);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_28a0);
    poVar4 = std::operator<<((ostream *)local_28a0,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xbc);
    std::operator<<(poVar4,
                    " match(\"\\xD0\\x96\",\"\\xD0\\xB6\",booster::regex::icase | booster::regex::utf8)"
                   );
    local_28c1 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_28c0);
    local_28c1 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_28c8 = 0;
  pcre_config(6,&local_28c8);
  if (local_28c8 == 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Unicode properties not compiled in");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2eb8,"\\p{Hebrew}",&local_2eb9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2ee0,"a",&local_2ee1);
    match(in_stack_ffffffffffffab10,in_stack_ffffffffffffab08,iVar3);
    std::__cxx11::string::~string(local_2ee0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2ee1);
    std::__cxx11::string::~string(local_2eb8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2eb9);
    std::__cxx11::ostringstream::ostringstream(local_3068);
    poVar4 = std::operator<<((ostream *)local_3068,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xca);
    std::operator<<(poVar4," match(\"\\\\p{Hebrew}\",\"a\",booster::regex::utf8)");
    local_3089 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_3088);
    local_3089 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"Testing Unicode Properties");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28e8,"\\p{Hebrew}",&local_28e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2910,anon_var_dwarf_32e4,&local_2911);
  bVar1 = match(in_stack_ffffffffffffab10,in_stack_ffffffffffffab08,iVar3);
  std::__cxx11::string::~string(local_2910);
  std::allocator<char>::~allocator((allocator<char> *)&local_2911);
  std::__cxx11::string::~string(local_28e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_28e9);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_2a90);
    poVar4 = std::operator<<((ostream *)local_2a90,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xc4);
    std::operator<<(poVar4," match(\"\\\\p{Hebrew}\",\"\\xD7\\x90\",booster::regex::utf8)");
    local_2ab1 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_2ab0);
    local_2ab1 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2ad8,"\\p{Hebrew}",&local_2ad9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b00,anon_var_dwarf_3310,&local_2b01);
  bVar1 = match(in_stack_ffffffffffffab10,in_stack_ffffffffffffab08,iVar3);
  std::__cxx11::string::~string(local_2b00);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b01);
  std::__cxx11::string::~string(local_2ad8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2ad9);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_2c80);
    poVar4 = std::operator<<((ostream *)local_2c80,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xc5);
    std::operator<<(poVar4," !match(\"\\\\p{Hebrew}\",\"\\xD0\\x96\",booster::regex::utf8)");
    local_2ca1 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_2ca0);
    local_2ca1 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2cc8,"\\p{Hebrew}",&local_2cc9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2cf0,"a",&local_2cf1);
  bVar1 = match(in_stack_ffffffffffffab10,in_stack_ffffffffffffab08,iVar3);
  std::__cxx11::string::~string(local_2cf0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2cf1);
  std::__cxx11::string::~string(local_2cc8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2cc9);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream(local_2e70);
    poVar4 = std::operator<<((ostream *)local_2e70,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xc6);
    std::operator<<(poVar4," !match(\"\\\\p{Hebrew}\",\"a\",booster::regex::utf8)");
    local_2e91 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_2e90);
    local_2e91 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"Testing match_result");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_32a8,"aab",&local_32a9);
  test_match<std::__cxx11::string,booster::match_results<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
            (in_stack_ffffffffffffc700);
  std::__cxx11::string::~string(local_32a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_32a9);
  test_match<char_const*,booster::match_results<char_const*>>((char *)in_stack_ffffffffffffc700);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_32d0,"foo",&local_32d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_32f8,"foo",&local_32f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3320,"foo",&local_3321);
  re_match((re_pattern_buffer *)0x1,(char *)local_32d0,(int)local_32f8,(int)local_3320,
           (re_registers *)0x0);
  std::__cxx11::string::~string(local_3320);
  std::allocator<char>::~allocator((allocator<char> *)&local_3321);
  std::__cxx11::string::~string(local_32f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_32f9);
  std::__cxx11::string::~string(local_32d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_32d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3348,"foo",&local_3349);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3370,"Foo",&local_3371);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3398,"",&local_3399);
  re_match((re_pattern_buffer *)0x0,(char *)local_3348,(int)local_3370,(int)local_3398,
           (re_registers *)0x0);
  std::__cxx11::string::~string(local_3398);
  std::allocator<char>::~allocator((allocator<char> *)&local_3399);
  std::__cxx11::string::~string(local_3370);
  std::allocator<char>::~allocator((allocator<char> *)&local_3371);
  std::__cxx11::string::~string(local_3348);
  std::allocator<char>::~allocator((allocator<char> *)&local_3349);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_33c0,"foo",&local_33c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_33e8,"Foo",&local_33e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3410,"",&local_3411);
  re_search((re_pattern_buffer *)0x0,(char *)local_33c0,(int)local_33e8,(int)local_3410,0,in_R9);
  std::__cxx11::string::~string(local_3410);
  std::allocator<char>::~allocator((allocator<char> *)&local_3411);
  std::__cxx11::string::~string(local_33e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_33e9);
  std::__cxx11::string::~string(local_33c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_33c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3438,"f.o",&local_3439);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3460,"foobar",&local_3461);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3488,"",&local_3489);
  re_match((re_pattern_buffer *)0x0,(char *)local_3438,(int)local_3460,(int)local_3488,
           (re_registers *)0x0);
  std::__cxx11::string::~string(local_3488);
  std::allocator<char>::~allocator((allocator<char> *)&local_3489);
  std::__cxx11::string::~string(local_3460);
  std::allocator<char>::~allocator((allocator<char> *)&local_3461);
  std::__cxx11::string::~string(local_3438);
  std::allocator<char>::~allocator((allocator<char> *)&local_3439);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_34b0,"f.o",&local_34b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_34d8,"foobar",&local_34d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3500,"foo",&local_3501);
  re_search((re_pattern_buffer *)0x1,(char *)local_34b0,(int)local_34d8,(int)local_3500,0,in_R9);
  std::__cxx11::string::~string(local_3500);
  std::allocator<char>::~allocator((allocator<char> *)&local_3501);
  std::__cxx11::string::~string(local_34d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_34d9);
  std::__cxx11::string::~string(local_34b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_34b1);
  poVar4 = std::operator<<((ostream *)&std::cout,"Testing regex match/search");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3530,"foo",&local_3531);
  booster::regex::regex(local_3510,local_3530,0);
  std::__cxx11::string::~string(local_3530);
  std::allocator<char>::~allocator((allocator<char> *)&local_3531);
  booster::match_results<const_char_*>::match_results(in_stack_ffffffffffffa8d0);
  bVar1 = booster::regex_search<booster::regex>
                    (in_stack_ffffffffffffa938,
                     (cmatch *)CONCAT17(in_stack_ffffffffffffa937,in_stack_ffffffffffffa930),
                     in_stack_ffffffffffffa928,iVar6);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_36d8);
    poVar4 = std::operator<<((ostream *)local_36d8,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xdf);
    std::operator<<(poVar4," booster::regex_search(\"foo\",cm,re)");
    local_36f9 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_36f8);
    local_36f9 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::match_results<const_char_*>::prefix(in_stack_ffffffffffffa8e0);
  bVar1 = booster::operator==((sub_match<const_char_*> *)in_stack_ffffffffffffa8d0,
                              in_stack_ffffffffffffa8c8);
  local_54aa = false;
  if (bVar1) {
    booster::match_results<const_char_*>::suffix(in_stack_ffffffffffffa8e0);
    local_54aa = booster::operator==((sub_match<const_char_*> *)in_stack_ffffffffffffa8d0,
                                     in_stack_ffffffffffffa8c8);
  }
  if (local_54aa == false) {
    std::__cxx11::ostringstream::ostringstream(local_38a8);
    poVar4 = std::operator<<((ostream *)local_38a8,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xe0);
    std::operator<<(poVar4," cm.prefix()==\"\" && cm.suffix()==\"\"");
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_38c8);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = booster::regex_search<booster::regex>
                    (in_stack_ffffffffffffa938,
                     (cmatch *)CONCAT17(in_stack_ffffffffffffa937,in_stack_ffffffffffffa930),
                     in_stack_ffffffffffffa928,iVar6);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_3a48);
    poVar4 = std::operator<<((ostream *)local_3a48,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xe2);
    std::operator<<(poVar4," booster::regex_search(\"foobee\",cm,re)");
    local_3a69 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_3a68);
    local_3a69 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::match_results<const_char_*>::prefix(in_stack_ffffffffffffa8e0);
  bVar1 = booster::operator==((sub_match<const_char_*> *)in_stack_ffffffffffffa8d0,
                              in_stack_ffffffffffffa8c8);
  local_550a = false;
  if (bVar1) {
    booster::match_results<const_char_*>::suffix(in_stack_ffffffffffffa8e0);
    local_550a = booster::operator==((sub_match<const_char_*> *)in_stack_ffffffffffffa8d0,
                                     in_stack_ffffffffffffa8c8);
  }
  if (local_550a == false) {
    std::__cxx11::ostringstream::ostringstream(local_3c18);
    poVar4 = std::operator<<((ostream *)local_3c18,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xe3);
    std::operator<<(poVar4," cm.prefix()==\"\" && cm.suffix()==\"bee\"");
    local_3c39 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_3c38);
    local_3c39 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = booster::regex_search<booster::regex>
                    (in_stack_ffffffffffffa938,
                     (cmatch *)CONCAT17(in_stack_ffffffffffffa937,in_stack_ffffffffffffa930),
                     in_stack_ffffffffffffa928,iVar6);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_3db8);
    poVar4 = std::operator<<((ostream *)local_3db8,"Error ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xe5);
    std::operator<<(poVar4," booster::regex_search(\"zfoo\",cm,re)");
    local_3dd9 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_3dd8);
    local_3dd9 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  booster::match_results<const_char_*>::prefix(in_stack_ffffffffffffa8e0);
  bVar1 = booster::operator==((sub_match<const_char_*> *)in_stack_ffffffffffffa8d0,
                              in_stack_ffffffffffffa8c8);
  local_556a = false;
  if (bVar1) {
    booster::match_results<const_char_*>::suffix(in_stack_ffffffffffffa8e0);
    local_556a = booster::operator==((sub_match<const_char_*> *)in_stack_ffffffffffffa8d0,
                                     in_stack_ffffffffffffa8c8);
  }
  if (local_556a != false) {
    bVar1 = booster::regex_search<booster::regex>
                      (in_stack_ffffffffffffa938,
                       (cmatch *)CONCAT17(in_stack_ffffffffffffa937,in_stack_ffffffffffffa930),
                       in_stack_ffffffffffffa928,iVar6);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_4128);
      poVar4 = std::operator<<((ostream *)local_4128,"Error ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xe8);
      std::operator<<(poVar4," booster::regex_search(\"zfoobee\",cm,re)");
      local_4149 = 1;
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar5,local_4148);
      local_4149 = 0;
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    booster::match_results<const_char_*>::prefix(in_stack_ffffffffffffa8e0);
    bVar1 = booster::operator==((sub_match<const_char_*> *)in_stack_ffffffffffffa8d0,
                                in_stack_ffffffffffffa8c8);
    local_55ca = false;
    if (bVar1) {
      booster::match_results<const_char_*>::suffix(in_stack_ffffffffffffa8e0);
      local_55ca = booster::operator==((sub_match<const_char_*> *)in_stack_ffffffffffffa8d0,
                                       in_stack_ffffffffffffa8c8);
    }
    iVar6 = (int)((ulong)in_stack_ffffffffffffa8e0 >> 0x20);
    if (local_55ca == false) {
      std::__cxx11::ostringstream::ostringstream(local_42f8);
      poVar4 = std::operator<<((ostream *)local_42f8,"Error ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xe9);
      std::operator<<(poVar4," cm.prefix()==\"z\" && cm.suffix()==\"bee\"");
      local_4319 = 1;
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar5,local_4318);
      local_4319 = 0;
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"Testing regex ctor/operator=");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    booster::regex::regex(local_4328);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4348,"(t(x))",&local_4349);
    booster::regex::assign((string *)local_4328,(int)local_4348);
    std::__cxx11::string::~string(local_4348);
    std::allocator<char>::~allocator((allocator<char> *)&local_4349);
    booster::regex::str_abi_cxx11_();
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffa8d0,in_stack_ffffffffffffa8c8);
    std::__cxx11::string::~string(local_4370);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_44e8);
      poVar4 = std::operator<<((ostream *)local_44e8,"Error ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xef);
      std::operator<<(poVar4," r.str()==\"(t(x))\"");
      local_4509 = 1;
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar5,local_4508);
      local_4509 = 0;
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar3 = booster::regex::mark_count();
    if (iVar3 != 2) {
      std::__cxx11::ostringstream::ostringstream(local_4688);
      poVar4 = std::operator<<((ostream *)local_4688,"Error ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xf0);
      std::operator<<(poVar4," r.mark_count() == 2");
      local_46a9 = 1;
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar5,local_46a8);
      local_46a9 = 0;
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    booster::regex::regex(local_46b8,local_4328);
    bVar1 = booster::regex_match<booster::regex>
                      (in_stack_ffffffffffffa8f0,in_stack_ffffffffffffa8e8,iVar6);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_4830);
      poVar4 = std::operator<<((ostream *)local_4830,"Error ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xf2);
      std::operator<<(poVar4," booster::regex_match(\"tx\",rc)");
      local_4851 = 1;
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar5,local_4850);
      local_4851 = 0;
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar1 = booster::regex_match<booster::regex>
                      (in_stack_ffffffffffffa8f0,in_stack_ffffffffffffa8e8,iVar6);
    if (bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_49d0);
      poVar4 = std::operator<<((ostream *)local_49d0,"Error ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xf3);
      std::operator<<(poVar4," !booster::regex_match(\"ty\",rc)");
      local_49f1 = 1;
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar5,local_49f0);
      local_49f1 = 0;
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    booster::regex::operator=(local_3510,local_4328);
    bVar1 = booster::regex_match<booster::regex>
                      (in_stack_ffffffffffffa8f0,in_stack_ffffffffffffa8e8,iVar6);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_4b70);
      poVar4 = std::operator<<((ostream *)local_4b70,"Error ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xf7);
      std::operator<<(poVar4," booster::regex_match(\"tx\",re)");
      local_4b91 = 1;
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar5,local_4b90);
      local_4b91 = 0;
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar1 = booster::regex_match<booster::regex>
                      (in_stack_ffffffffffffa8f0,in_stack_ffffffffffffa8e8,iVar6);
    if (bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_4d10);
      poVar4 = std::operator<<((ostream *)local_4d10,"Error ");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xf8);
      std::operator<<(poVar4," !booster::regex_match(\"ty\",re)");
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar5,local_4d30);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    booster::regex::~regex(local_46b8);
    booster::regex::~regex(local_4328);
    booster::match_results<const_char_*>::~match_results((match_results<const_char_*> *)0x1134ae);
    booster::regex::~regex(local_3510);
    poVar4 = std::operator<<((ostream *)&std::cout,"Ok");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    return 0;
  }
  std::__cxx11::ostringstream::ostringstream(local_3f88);
  poVar4 = std::operator<<((ostream *)local_3f88,"Error ");
  poVar4 = std::operator<<(poVar4,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
                          );
  poVar4 = std::operator<<(poVar4,":");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xe6);
  std::operator<<(poVar4," cm.prefix()==\"z\" && cm.suffix()==\"\"");
  local_3fa9 = 1;
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(prVar5,local_3fa8);
  local_3fa9 = 0;
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main()
{
	try {
		{
			std::cout << "Testing search/match" << std::endl;
			TEST(search("foo","foo"));
			TEST(search("foo","foobar"));
			TEST(search("foo","zeefoo"));
			TEST(!search("foo","bar"));

			TEST(match("foo","foo"));
			TEST(match("(http|https|ftp|mailto)","https"));
			TEST(!match("foo","zeefoo"));
			TEST(!match("foo","foobar"));
			TEST(match("(foo)","foo"));
			TEST(!match("(foo)","zeefoo"));
			TEST(!match("(foo)","foobar"));
			TEST(match("((((((((((foo))))))))))","foo"));
			TEST(!match("((((((((((foo))))))))))","foox"));
			TEST(!match("((((((((((foo))))))))))","xfoo"));
			
			TEST(!match("a","A",0));
			TEST(!search("a","xAz",0));
			TEST(match("a","A",booster::regex::icase));
			TEST(search("a","xAz",booster::regex::icase));


			if(booster::regex::utf8_supported()) {

				std::cout << "Testing UTF-8" << std::endl;
				TEST(match(".","\xD7\x90",booster::regex::utf8));
				TEST(match(".","\xD0\x96",booster::regex::utf8));
				TEST(match("\xD0\x96","\xD0\xB6",booster::regex::icase | booster::regex::utf8));

				int prop=0;
				#ifndef BOOSTER_NO_PCRE
				pcre_config(PCRE_CONFIG_UNICODE_PROPERTIES,&prop);
				#endif
				if(prop) {
					std::cout << "Testing Unicode Properties" << std::endl;
					TEST(match("\\p{Hebrew}","\xD7\x90",booster::regex::utf8));
					TEST(!match("\\p{Hebrew}","\xD0\x96",booster::regex::utf8));
					TEST(!match("\\p{Hebrew}","a",booster::regex::utf8));
				}
				else {
					std::cout << "Unicode properties not compiled in" << std::endl;
					THROWS(match("\\p{Hebrew}","a",booster::regex::utf8),booster::regex_error);
				}
			}
			else {
				std::cout << "UTF-8 is not compiled in" << std::endl;
				THROWS(match(".","a",booster::regex::utf8),booster::regex_error);
			}
			
			std::cout << "Testing match_result" << std::endl;
			test_match<std::string,booster::smatch>("aab");
			test_match<char const *,booster::cmatch>("aab");

			re_match(true,"foo","foo","foo",0);
			re_match(false,"foo","Foo");
			re_search(false,"foo","Foo");
			re_match(false,"f.o","foobar");
			re_search(true,"f.o","foobar","foo",0);

			std::cout << "Testing regex match/search" << std::endl;
			booster::regex re("foo");
			booster::cmatch cm;
			TEST(booster::regex_search("foo",cm,re));
			TEST(cm.prefix()=="" && cm.suffix()=="");
			
			TEST(booster::regex_search("foobee",cm,re));
			TEST(cm.prefix()=="" && cm.suffix()=="bee");
			
			TEST(booster::regex_search("zfoo",cm,re));
			TEST(cm.prefix()=="z" && cm.suffix()=="");

			TEST(booster::regex_search("zfoobee",cm,re));
			TEST(cm.prefix()=="z" && cm.suffix()=="bee");

			{
				std::cout << "Testing regex ctor/operator=" << std::endl;
				booster::regex r;
				r.assign("(t(x))");
				TEST(r.str()=="(t(x))");
				TEST(r.mark_count() == 2);
				booster::regex rc(r);
				TEST(booster::regex_match("tx",rc));
				TEST(!booster::regex_match("ty",rc));

				re = r;

				TEST(booster::regex_match("tx",re));
				TEST(!booster::regex_match("ty",re));

			}

		}
	}
	catch(std::exception const &e) {
		std::cerr << "Fail: " << e.what() << std::endl;
		return 1;
	}
	std::cout << "Ok" << std::endl;
	return 0;
}